

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O1

int find(char *name)

{
  char cVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  cVar1 = *name;
  iVar5 = (int)cVar1;
  if (cVar1 == '\0') {
    iVar6 = 0;
  }
  else {
    cVar2 = name[1];
    iVar6 = iVar5;
    if (cVar2 != '\0') {
      if (name[2] == '\0') {
        iVar6 = iVar5 * 0x1f + (int)cVar2;
      }
      else {
        iVar6 = cVar2 * 0x1f + (int)name[2] + iVar5 * 0x47;
      }
    }
  }
  if (cVar1 == '\0') {
    iVar5 = 1;
  }
  else if (name[1] == '\0') {
    iVar5 = iVar5 * 3;
  }
  else {
    iVar5 = name[1] * 3 + iVar5 * 0x33;
  }
  iVar6 = iVar6 % 0xd3;
  lVar4 = (long)iVar6;
  cVar1 = symbols[lVar4].notempty;
  while ((cVar1 != '\0' && (iVar3 = strcmp(symbols[lVar4].name,name), iVar3 != 0))) {
    iVar6 = (int)(iVar6 + iVar5 % 0xd3 + (uint)(iVar5 % 0xd3 == 0)) % 0xd3;
    lVar4 = (long)iVar6;
    cVar1 = symbols[lVar4].notempty;
  }
  return iVar6;
}

Assistant:

static int find(const char *name) {
// returns hash entry if it exists, or first empty slot:
  int pos = name[0] ? (
    name[1] ? (
      name[2] ? 71*name[0]+31*name[1]+name[2] : 31*name[0]+name[1]
    ) :
      name[0]
  ) : 0;
  pos %= MAXSYMBOL;
  int hh2 = name[0] ? (
    (name[1]) ? 51*name[0]+3*name[1] : 3*name[0]
    ) : 1;
  hh2 %= MAXSYMBOL; if (!hh2) hh2 = 1;
  for (;;) {
    if (!symbols[pos].notempty) return pos;
    if (!strcmp(symbols[pos].name,name)) return pos;
    pos = (pos + hh2) % MAXSYMBOL;
  }
}